

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintStats(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  uint local_60;
  int c;
  int fPrintMem;
  int fSkipBuf;
  int fGlitch;
  int fPower;
  int fPrintMuxes;
  int fPrintTime;
  int fUseLutLib;
  int fDumpResult;
  int fSaveBest;
  int fFactor;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadNtk(pAbc);
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fDumpResult = 0;
  fUseLutLib = 0;
  fPrintTime = 0;
  fPrintMuxes = 0;
  bVar1 = false;
  fGlitch = 0;
  fSkipBuf = 0;
  fPrintMem = 0;
  c = 0;
  local_60 = 0;
  Extra_UtilGetoptReset();
LAB_0021473e:
  iVar2 = Extra_UtilGetopt(argc,argv,"fbdltmpgsuh");
  if (iVar2 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar2 = Abc_NtkIsLogic(pNtk_00);
      if ((iVar2 == 0) && (fPrintMuxes != 0)) {
        Abc_Print(-1,"Cannot print LUT delay for a non-logic network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_NtkPrintStats(pNtk_00,fDumpResult,fUseLutLib,fPrintTime,fPrintMuxes,fGlitch,fSkipBuf,
                          fPrintMem,c,local_60);
        if (bVar1) {
          pAbc->TimeTotal = pAbc->TimeCommand + pAbc->TimeTotal;
          Abc_Print(1,"elapse: %3.2f seconds, total: %3.2f seconds\n",pAbc->TimeCommand,
                    pAbc->TimeTotal);
          pAbc->TimeCommand = 0.0;
        }
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x62:
    fUseLutLib = fUseLutLib ^ 1;
    goto LAB_0021473e;
  default:
    break;
  case 100:
    fPrintTime = fPrintTime ^ 1;
    goto LAB_0021473e;
  case 0x66:
    fDumpResult = fDumpResult ^ 1;
    goto LAB_0021473e;
  case 0x67:
    fPrintMem = fPrintMem ^ 1;
    goto LAB_0021473e;
  case 0x68:
    break;
  case 0x6c:
    fPrintMuxes = fPrintMuxes ^ 1;
    goto LAB_0021473e;
  case 0x6d:
    fGlitch = fGlitch ^ 1;
    goto LAB_0021473e;
  case 0x70:
    fSkipBuf = fSkipBuf ^ 1;
    goto LAB_0021473e;
  case 0x73:
    c = c ^ 1;
    goto LAB_0021473e;
  case 0x74:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0021473e;
  case 0x75:
    goto switchD_00214784_caseD_75;
  }
  Abc_Print(-2,"usage: print_stats [-fbdltmpgsuh]\n");
  Abc_Print(-2,"\t        prints the network statistics\n");
  pcVar3 = "no";
  if (fDumpResult != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-f    : toggles printing the literal count in the factored forms [default = %s]\n"
            ,pcVar3);
  pcVar3 = "no";
  if (fUseLutLib != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-b    : toggles saving the best logic network in \"best.blif\" [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fPrintTime != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-d    : toggles dumping statistics about the network into file [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fUseLutLib != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-l    : toggles printing delay of LUT mapping using LUT library [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-t    : toggles printing runtime statistics [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fGlitch != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-m    : toggles printing MUX statistics [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fSkipBuf != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-p    : toggles printing power dissipation due to switching [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fPrintMem != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,
            "\t-g    : toggles printing percentage of increased power due to glitching [default = %s]\n"
            ,pcVar3);
  pcVar3 = "no";
  if (c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s    : toggles not counting single-output nodes as nodes [default = %s]\n",pcVar3
           );
  pcVar3 = "no";
  if (local_60 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-u    : toggles printing memory usage [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_00214784_caseD_75:
  local_60 = local_60 ^ 1;
  goto LAB_0021473e;
}

Assistant:

int Abc_CommandPrintStats( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int fFactor;
    int fSaveBest;
    int fDumpResult;
    int fUseLutLib;
    int fPrintTime;
    int fPrintMuxes;
    int fPower;
    int fGlitch;
    int fSkipBuf;
    int fPrintMem;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);

    // set the defaults
    fFactor   = 0;
    fSaveBest = 0;
    fDumpResult = 0;
    fUseLutLib = 0;
    fPrintTime = 0;
    fPrintMuxes = 0;
    fPower = 0;
    fGlitch = 0;
    fSkipBuf = 0;
    fPrintMem = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fbdltmpgsuh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFactor ^= 1;
            break;
        case 'b':
            fSaveBest ^= 1;
            break;
        case 'd':
            fDumpResult ^= 1;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 't':
            fPrintTime ^= 1;
            break;
        case 'm':
            fPrintMuxes ^= 1;
            break;
        case 'p':
            fPower ^= 1;
            break;
        case 'g':
            fGlitch ^= 1;
            break;
        case 's':
            fSkipBuf ^= 1;
            break;
        case 'u':
            fPrintMem ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) && fUseLutLib )
    {
        Abc_Print( -1, "Cannot print LUT delay for a non-logic network.\n" );
        return 1;
    }
    Abc_NtkPrintStats( pNtk, fFactor, fSaveBest, fDumpResult, fUseLutLib, fPrintMuxes, fPower, fGlitch, fSkipBuf, fPrintMem );
    if ( fPrintTime )
    {
        pAbc->TimeTotal += pAbc->TimeCommand;
        Abc_Print( 1, "elapse: %3.2f seconds, total: %3.2f seconds\n", pAbc->TimeCommand, pAbc->TimeTotal );
        pAbc->TimeCommand = 0.0;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_stats [-fbdltmpgsuh]\n" );
    Abc_Print( -2, "\t        prints the network statistics\n" );
    Abc_Print( -2, "\t-f    : toggles printing the literal count in the factored forms [default = %s]\n", fFactor? "yes": "no" );
    Abc_Print( -2, "\t-b    : toggles saving the best logic network in \"best.blif\" [default = %s]\n", fSaveBest? "yes": "no" );
    Abc_Print( -2, "\t-d    : toggles dumping statistics about the network into file [default = %s]\n", fDumpResult? "yes": "no" );
    Abc_Print( -2, "\t-l    : toggles printing delay of LUT mapping using LUT library [default = %s]\n", fSaveBest? "yes": "no" );
    Abc_Print( -2, "\t-t    : toggles printing runtime statistics [default = %s]\n", fPrintTime? "yes": "no" );
    Abc_Print( -2, "\t-m    : toggles printing MUX statistics [default = %s]\n", fPrintMuxes? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggles printing power dissipation due to switching [default = %s]\n", fPower? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggles printing percentage of increased power due to glitching [default = %s]\n", fGlitch? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggles not counting single-output nodes as nodes [default = %s]\n", fSkipBuf? "yes": "no" );
    Abc_Print( -2, "\t-u    : toggles printing memory usage [default = %s]\n", fPrintMem? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}